

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O0

ostream * jhu::thrax::operator<<(ostream *out,PhrasalRule *rule)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  int in_R8D;
  string_view nt;
  PhrasalRule *rule_local;
  ostream *out_local;
  
  nt._M_str = (char *)0x0;
  nt._M_len = (size_t)(rule->lhs).label._M_str;
  bracket((thrax *)out,(ostream *)(rule->lhs).label._M_len,nt,in_R8D);
  __str_01._M_str = "\t";
  __str_01._M_len = 1;
  std::operator<<(out,__str_01);
  printRhs<true>(out,rule);
  __str_00._M_str = "\t";
  __str_00._M_len = 1;
  std::operator<<(out,__str_00);
  printRhs<false>(out,rule);
  __str._M_str = "\t";
  __str._M_len = 1;
  std::operator<<(out,__str);
  PhrasalRule::printAlignment(rule,out);
  return out;
}

Assistant:

inline std::ostream& operator<<(std::ostream& out, const PhrasalRule& rule) {
  const static std::string_view kSep = "\t";
  bracket(out, rule.lhs.label, kLhsIndex);
  out << kSep;
  printRhs<true>(out, rule);
  out << kSep;
  printRhs<false>(out, rule);
  out << kSep;
  rule.printAlignment(out);
  return out;
}